

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O1

ChCoordsys<double> * __thiscall
chrono::ChLinkRevoluteTranslational::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkRevoluteTranslational *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ChBodyFrame *pCVar14;
  ChBodyFrame *pCVar15;
  double dVar16;
  char cVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  ulong local_98;
  double local_38;
  double local_30;
  ulong local_28;
  
  pCVar14 = (this->super_ChLink).Body2;
  pCVar15 = (this->super_ChLink).Body1;
  ChTransform<double>::TransformLocalToParent
            (&this->m_p1,&(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar15->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  dVar1 = (pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar2 = (pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_28;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_28;
  dVar28 = (pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar28;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar28;
  dVar3 = (pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
          super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar4 = *(double *)
           ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x18);
  dVar5 = *(double *)
           ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x30);
  dVar6 = *(double *)
           ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8
           );
  dVar7 = *(double *)
           ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x20);
  dVar8 = *(double *)
           ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x38);
  dVar31 = *(double *)
            ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x10);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar31;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar31;
  dVar32 = *(double *)
            ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x28);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar32;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar32;
  dVar9 = *(double *)
           ((long)&(pCVar14->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x40);
  dVar22 = (this->m_x2).m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar22;
  dVar23 = (this->m_x2).m_data[1];
  dVar10 = (this->m_y2).m_data[2];
  dVar11 = (this->m_x2).m_data[2];
  dVar12 = (this->m_y2).m_data[1];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar12;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar11;
  auVar18 = vmulsd_avx512f(auVar29,auVar56);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar23;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar10;
  auVar19 = vfmsub231sd_avx512f(auVar18,auVar55,auVar58);
  dVar13 = (this->m_y2).m_data[0];
  auVar18 = vmulsd_avx512f(auVar58,auVar21);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar13;
  auVar20 = vfmsub231sd_avx512f(auVar18,auVar56,auVar60);
  auVar18 = vmulsd_avx512f(auVar60,auVar55);
  auVar18 = vfmsub231sd_fma(auVar18,auVar21,auVar29);
  dVar30 = auVar18._0_8_;
  dVar16 = dVar12 + dVar22 + dVar30;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar23;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar11;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar10;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar13;
  if (0.0 <= dVar16) {
    dVar16 = dVar16 + 1.0;
    if (dVar16 < 0.0) {
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_28;
      vmovsd_avx512f(auVar44);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar28;
      vmovsd_avx512f(auVar47);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar31;
      vmovsd_avx512f(auVar50);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar32;
      vmovsd_avx512f(auVar53);
      vmovsd_avx512f(auVar18);
      vmovsd_avx512f(auVar57);
      vmovsd_avx512f(auVar59);
      vmovsd_avx512f(auVar19);
      vmovsd_avx512f(auVar61);
      vmovsd_avx512f(auVar20);
      dVar22 = sqrt(dVar16);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_e0;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_d8;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_d0;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_c8;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_c0;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_b8;
      local_28 = local_98;
    }
    else {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar16;
      auVar21 = vsqrtsd_avx(auVar24,auVar24);
      dVar22 = auVar21._0_8_;
      local_a0 = dVar28;
      local_b0 = dVar32;
      local_a8 = dVar31;
    }
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_a8;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_b0;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_a0;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_28;
    dVar32 = dVar22 * 0.5;
    dVar22 = 0.5 / dVar22;
    auVar20 = vsubsd_avx512f(auVar59,auVar20);
    dVar28 = auVar20._0_8_ * dVar22;
    auVar19 = vsubsd_avx512f(auVar19,auVar57);
    dVar31 = auVar19._0_8_ * dVar22;
    auVar18 = vsubsd_avx512f(auVar18,auVar61);
    dVar22 = auVar18._0_8_ * dVar22;
  }
  else {
    cVar17 = dVar22 < dVar12;
    dVar28 = dVar22;
    if ((bool)cVar17) {
      dVar28 = dVar12;
    }
    if (dVar28 < dVar30) {
      cVar17 = '\x02';
    }
    if (cVar17 == '\x02') {
      dVar28 = ((dVar30 - dVar22) - dVar12) + 1.0;
      if (dVar28 < 0.0) {
        vmovsd_avx512f(auVar43);
        vmovsd_avx512f(auVar46);
        vmovsd_avx512f(auVar49);
        vmovsd_avx512f(auVar52);
        vmovsd_avx512f(auVar18);
        vmovsd_avx512f(auVar57);
        vmovsd_avx512f(auVar59);
        vmovsd_avx512f(auVar19);
        vmovsd_avx512f(auVar61);
        vmovsd_avx512f(auVar20);
        dVar23 = sqrt(dVar28);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_e0;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = local_d8;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_d0;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_c8;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = local_c0;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_b8;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = local_b0;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = local_a8;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_a0;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = local_98;
      }
      else {
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar28;
        auVar21 = vsqrtsd_avx(auVar26,auVar26);
        dVar23 = auVar21._0_8_;
      }
      dVar22 = dVar23 * 0.5;
      dVar23 = 0.5 / dVar23;
      auVar19 = vaddsd_avx512f(auVar57,auVar19);
      dVar28 = auVar19._0_8_ * dVar23;
      auVar19 = vaddsd_avx512f(auVar59,auVar20);
      dVar31 = auVar19._0_8_ * dVar23;
      auVar18 = vsubsd_avx512f(auVar18,auVar61);
      dVar32 = auVar18._0_8_;
    }
    else if (cVar17 == '\x01') {
      dVar28 = ((dVar12 - dVar30) - dVar22) + 1.0;
      if (dVar28 < 0.0) {
        vmovsd_avx512f(auVar43);
        vmovsd_avx512f(auVar46);
        vmovsd_avx512f(auVar49);
        vmovsd_avx512f(auVar52);
        vmovsd_avx512f(auVar18);
        vmovsd_avx512f(auVar57);
        vmovsd_avx512f(auVar59);
        vmovsd_avx512f(auVar19);
        vmovsd_avx512f(auVar61);
        vmovsd_avx512f(auVar20);
        dVar23 = sqrt(dVar28);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_e0;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = local_d8;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_d0;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_c8;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = local_c0;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_b8;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = local_b0;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = local_a8;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_a0;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = local_98;
      }
      else {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar28;
        auVar21 = vsqrtsd_avx(auVar25,auVar25);
        dVar23 = auVar21._0_8_;
      }
      dVar31 = dVar23 * 0.5;
      dVar23 = 0.5 / dVar23;
      auVar20 = vaddsd_avx512f(auVar59,auVar20);
      dVar22 = auVar20._0_8_ * dVar23;
      auVar18 = vaddsd_avx512f(auVar18,auVar61);
      dVar28 = auVar18._0_8_ * dVar23;
      auVar18 = vsubsd_avx512f(auVar19,auVar57);
      dVar32 = auVar18._0_8_;
    }
    else {
      dVar28 = ((dVar22 - dVar12) - dVar30) + 1.0;
      if (dVar28 < 0.0) {
        vmovsd_avx512f(auVar43);
        vmovsd_avx512f(auVar46);
        vmovsd_avx512f(auVar49);
        vmovsd_avx512f(auVar52);
        vmovsd_avx512f(auVar18);
        vmovsd_avx512f(auVar57);
        vmovsd_avx512f(auVar59);
        vmovsd_avx512f(auVar19);
        vmovsd_avx512f(auVar61);
        vmovsd_avx512f(auVar20);
        dVar23 = sqrt(dVar28);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_e0;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = local_d8;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_d0;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_c8;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = local_c0;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_b8;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = local_b0;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = local_a8;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_a0;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = local_98;
      }
      else {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar28;
        auVar21 = vsqrtsd_avx(auVar27,auVar27);
        dVar23 = auVar21._0_8_;
      }
      dVar28 = dVar23 * 0.5;
      dVar23 = 0.5 / dVar23;
      auVar18 = vaddsd_avx512f(auVar18,auVar61);
      dVar31 = auVar18._0_8_ * dVar23;
      auVar18 = vaddsd_avx512f(auVar57,auVar19);
      dVar22 = auVar18._0_8_ * dVar23;
      auVar18 = vsubsd_avx512f(auVar59,auVar20);
      dVar32 = auVar18._0_8_;
    }
    dVar32 = dVar32 * dVar23;
  }
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar5;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar3;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar8;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar6;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar9;
  auVar20 = vsubsd_avx512f(auVar45,auVar48);
  dVar1 = local_38 - dVar1;
  dVar2 = local_30 - dVar2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2;
  auVar18 = vmulsd_avx512f(auVar35,auVar54);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1;
  auVar18 = vfmadd213sd_avx512f(auVar51,auVar33,auVar18);
  auVar21 = vfmadd213sd_avx512f(auVar41,auVar20,auVar18);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar7 * dVar2;
  auVar18 = vfmadd213sd_fma(auVar42,auVar33,auVar37);
  auVar18 = vfmadd213sd_fma(auVar40,auVar20,auVar18);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar4 * dVar2;
  auVar19 = vfmadd213sd_fma(auVar38,auVar34,auVar36);
  auVar19 = vfmadd213sd_fma(auVar39,auVar20,auVar19);
  (__return_storage_ptr__->pos).m_data[0] = auVar19._0_8_;
  (__return_storage_ptr__->pos).m_data[1] = auVar18._0_8_;
  (__return_storage_ptr__->pos).m_data[2] = auVar21._0_8_;
  (__return_storage_ptr__->rot).m_data[0] = dVar32;
  (__return_storage_ptr__->rot).m_data[1] = dVar28;
  (__return_storage_ptr__->rot).m_data[2] = dVar31;
  (__return_storage_ptr__->rot).m_data[3] = dVar22;
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChLinkRevoluteTranslational::GetLinkRelativeCoords() {
    // Origin at P1 (center of revolute side) and orientation formed using
    // the mutually orthogonal direction x2 and y2.
    ChVector<> p = Body2->TransformPointParentToLocal(Body1->TransformPointLocalToParent(m_p1));
    ChMatrix33<> A(m_x2, m_y2, Vcross(m_x2, m_y2));

    return ChCoordsys<>(p, A.Get_A_quaternion());
}